

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O2

Time __thiscall helics::TimeCoordinator::getNextPossibleTime(TimeCoordinator *this)

{
  long lVar1;
  Time TVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if ((this->time_granted).internalTimeCode == 0) {
    lVar1 = (this->info).timeDelta.internalTimeCode;
    lVar5 = (this->info).offset.internalTimeCode;
    lVar4 = lVar5;
    if (lVar5 <= lVar1) {
      TVar2.internalTimeCode = (this->info).period.internalTimeCode;
      if (lVar5 == 0) {
        if (TVar2.internalTimeCode < lVar1) {
          TVar2.internalTimeCode = lVar1;
        }
        TVar2 = generateAllowedTime(this,TVar2);
        return (Time)TVar2.internalTimeCode;
      }
      lVar4 = lVar1;
      if (1 < TVar2.internalTimeCode) {
        lVar4 = TVar2.internalTimeCode + lVar5;
        lVar3 = lVar1;
        if (lVar1 <= lVar4) {
          lVar3 = lVar4;
        }
        lVar4 = lVar5 + ((lVar3 - (lVar4 + (ulong)(lVar4 < lVar1))) / (ulong)TVar2.internalTimeCode
                         + (ulong)(lVar4 < lVar1) + 1) * TVar2.internalTimeCode;
      }
    }
  }
  else {
    lVar1 = (this->info).timeDelta.internalTimeCode;
    lVar5 = (this->info).period.internalTimeCode;
    if (lVar5 < lVar1) {
      lVar5 = lVar1;
    }
    lVar1 = (this->time_grantBase).internalTimeCode;
    lVar4 = 0x7fffffffffffffff;
    if (lVar1 < 0x7fffffffffffffff - lVar5) {
      TVar2 = generateAllowedTime(this,(Time)(lVar5 + lVar1));
      return (Time)TVar2.internalTimeCode;
    }
  }
  return (Time)lVar4;
}

Assistant:

bool operator==(const TimeRepresentation& rhs) const noexcept
    {
        return (internalTimeCode == rhs.internalTimeCode);
    }